

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::isTrailCC01ForCompBoundaryAfter(Normalizer2Impl *this,uint16_t norm16)

{
  uint uVar1;
  undefined6 in_register_00000032;
  bool bVar2;
  
  bVar2 = true;
  uVar1 = (uint)CONCAT62(in_register_00000032,norm16);
  if (uVar1 != 1) {
    if (norm16 < this->limitNoNo) {
      bVar2 = *(ushort *)((long)this->extraData + (ulong)(uVar1 & 0xfffe)) < 0x200;
    }
    else {
      bVar2 = (norm16 & 6) < 3;
    }
  }
  return bVar2;
}

Assistant:

UBool isTrailCC01ForCompBoundaryAfter(uint16_t norm16) const {
        return isInert(norm16) || (isDecompNoAlgorithmic(norm16) ?
            (norm16 & DELTA_TCCC_MASK) <= DELTA_TCCC_1 : *getMapping(norm16) <= 0x1ff);
    }